

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<siginfo_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:244:29)>
::getImpl(SimpleTransformPromiseNode<siginfo_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:244:29)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  ExceptionOr<siginfo_t> depResult;
  ExceptionOr<kj::_::Void> local_3f0;
  ExceptionOrValue local_250;
  char local_b8;
  
  local_250.exception.ptr.isSet = false;
  local_b8 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_250);
  uVar1 = local_250.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_250.exception.ptr.isSet == true) {
    local_3f0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_250.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_250.exception.ptr.field_1.value.ownFile.content.size_;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_250.exception.ptr.field_1.value.ownFile.content.disposer;
    local_250.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_250.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_250.exception.ptr.field_1.value.file;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_250.exception.ptr.field_1._32_8_;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_250.exception.ptr.field_1.value.description.content.ptr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_250.exception.ptr.field_1.value.description.content.size_;
    local_250.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_250.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_250.exception.ptr.field_1.value.description.content.disposer;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_250.exception.ptr.field_1.value.context.ptr.disposer;
    local_250.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar1;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_250.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_250.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_250.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_250.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_250.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3f0.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_250.exception.ptr.field_1 + 0x68),0x105);
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_250.exception.ptr.field_1.value.details.builder.ptr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_250.exception.ptr.field_1.value.details.builder.pos;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_250.exception.ptr.field_1.value.details.builder.endPtr;
    local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_250.exception.ptr.field_1.value.details.builder.disposer;
    local_250.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_250.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_250.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3f0.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3f0);
  }
  else {
    if (local_b8 != '\x01') goto LAB_001df23c;
    if (Debug::minSeverity < 3) {
      Debug::log<char_const(&)[23]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0xf5,ERROR,"\"Received wrong signal.\"",(char (*) [23])"Received wrong signal.");
    }
    local_3f0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3f0.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_3f0);
  }
  if (local_3f0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3f0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_001df23c:
  if (local_250.exception.ptr.isSet == true) {
    Exception::~Exception(&local_250.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }